

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O1

bool vera::intersection(Line *_A,Line *_B,vec3 *_p,float _threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (_A->m_direction).field_0.x;
  fVar2 = (_A->m_direction).field_1.y;
  fVar3 = (_A->m_direction).field_2.z;
  fVar12 = (_B->m_direction).field_0.x;
  fVar6 = (_B->m_direction).field_1.y;
  fVar7 = (_B->m_direction).field_2.z;
  fVar8 = _A->m_points[0].field_0.x;
  fVar10 = _A->m_points[0].field_1.y;
  fVar11 = _B->m_points[0].field_0.x - fVar8;
  fVar14 = _B->m_points[0].field_1.y - fVar10;
  fVar13 = fVar2 * fVar7 - fVar3 * fVar6;
  fVar5 = fVar3 * fVar12 - fVar1 * fVar7;
  fVar9 = fVar1 * fVar6 - fVar2 * fVar12;
  fVar4 = _A->m_points[0].field_2.z;
  fVar15 = _B->m_points[0].field_2.z - fVar4;
  if (((ABS(fVar9 * fVar15 + fVar5 * fVar14 + fVar13 * fVar11) <= _threshold) &&
      (fVar12 = ((fVar11 * fVar6 + -fVar12 * fVar14) * fVar9 +
                (fVar15 * fVar12 + -fVar7 * fVar11) * fVar5 +
                (-fVar6 * fVar15 + fVar14 * fVar7) * fVar13) /
                (fVar9 * fVar9 + fVar5 * fVar5 + fVar13 * fVar13), 0.0 <= fVar12)) &&
     (fVar12 <= 1.0)) {
    fVar4 = fVar4 + fVar3 * fVar12;
    _p->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                  (fVar8 + fVar1 * fVar12);
    _p->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                  (fVar10 + fVar2 * fVar12);
    (_p->field_2).z = fVar4;
    fVar6 = (_p->field_0).x - _B->m_points[0].field_0.x;
    fVar8 = (_p->field_1).y - _B->m_points[0].field_1.y;
    fVar10 = fVar4 - _B->m_points[0].field_2.z;
    fVar12 = (_p->field_0).x - _B->m_points[1].field_0.x;
    fVar7 = (_p->field_1).y - _B->m_points[1].field_1.y;
    fVar4 = fVar4 - _B->m_points[1].field_2.z;
    fVar1 = (_B->m_direction).field_0.x;
    fVar2 = (_B->m_direction).field_1.y;
    fVar3 = (_B->m_direction).field_2.z;
    if (fVar4 * fVar4 + fVar7 * fVar7 + fVar12 * fVar12 +
        fVar10 * fVar10 + fVar8 * fVar8 + fVar6 * fVar6 <=
        fVar3 * fVar3 + fVar2 * fVar2 + fVar1 * fVar1 + 0.001) {
      return true;
    }
  }
  return false;
}

Assistant:

bool intersection(const Line& _A, const Line& _B, glm::vec3& _p, float _threshold ) {
    // Unnormalized direction of the ray
    glm::vec3 da = _A.getDireciton();
    glm::vec3 db = _B.getDireciton();
    glm::vec3 dc = _B[0] - _A[0];
    glm::vec3 cross_da_db = glm::cross(da, db);
    
    // lines are not coplanar
    if ( std::abs( glm::dot(dc, cross_da_db)) > _threshold)
        return false;
        
    // Means we have an intersection
    float s = glm::dot( glm::cross(dc, db),  cross_da_db) / glm::length2( cross_da_db );
    if (s >= 0.0 && s <= 1.0) {
        _p = _A[0] + da * s;
        
        // See if this lies on the segment
        if ( (glm::length2(_p - _B[0]) + glm::length2(_p - _B[1])) <= (glm::length2(_B.getDireciton()) + lengthErrorThreshold) )
            return true;
    }

    return false;
}